

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

int get_comp_index_context(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  MB_MODE_INFO *mbmi_00;
  MB_MODE_INFO *mbmi_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  RefCntBuffer *pRVar5;
  RefCntBuffer *pRVar6;
  long in_RSI;
  long in_RDI;
  int offset;
  int left_ctx;
  int above_ctx;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  int bck;
  int fwd;
  int cur_frame_index;
  int fwd_frame_index;
  int bck_frame_index;
  RefCntBuffer *fwd_buf;
  RefCntBuffer *bck_buf;
  MB_MODE_INFO *mbmi;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  uint local_54;
  uint local_30;
  uint local_2c;
  
  pRVar5 = get_ref_frame_buf((AV1_COMMON *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff9f);
  pRVar6 = get_ref_frame_buf((AV1_COMMON *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff9f);
  local_2c = 0;
  local_30 = 0;
  iVar3 = *(int *)(*(long *)(in_RDI + 0xe8) + 4);
  if (pRVar5 != (RefCntBuffer *)0x0) {
    local_2c = pRVar5->order_hint;
  }
  if (pRVar6 != (RefCntBuffer *)0x0) {
    local_30 = pRVar6->order_hint;
  }
  iVar2 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x6088) + 0x28),local_30,iVar3);
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  iVar3 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x6088) + 0x28),iVar3,local_2c);
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  mbmi_00 = *(MB_MODE_INFO **)(in_RSI + 0x1ed0);
  mbmi_01 = *(MB_MODE_INFO **)(in_RSI + 0x1ec8);
  local_54 = 0;
  local_58 = 0;
  uVar4 = (uint)(iVar2 == iVar3);
  if (mbmi_00 != (MB_MODE_INFO *)0x0) {
    iVar3 = has_second_ref(mbmi_00);
    if (iVar3 == 0) {
      bVar1 = mbmi_00->ref_frame[0] == '\a';
    }
    else {
      bVar1 = (bool)((byte)((ushort)*(undefined2 *)&mbmi_00->field_0xa7 >> 9) & 1);
    }
    local_54 = (uint)bVar1;
  }
  if (mbmi_01 != (MB_MODE_INFO *)0x0) {
    iVar3 = has_second_ref(mbmi_01);
    if (iVar3 == 0) {
      bVar1 = mbmi_01->ref_frame[0] == '\a';
    }
    else {
      bVar1 = (bool)((byte)((ushort)*(undefined2 *)&mbmi_01->field_0xa7 >> 9) & 1);
    }
    local_58 = (uint)bVar1;
  }
  return local_54 + local_58 + uVar4 * 3;
}

Assistant:

static inline int get_comp_index_context(const AV1_COMMON *cm,
                                         const MACROBLOCKD *xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const RefCntBuffer *const bck_buf = get_ref_frame_buf(cm, mbmi->ref_frame[0]);
  const RefCntBuffer *const fwd_buf = get_ref_frame_buf(cm, mbmi->ref_frame[1]);
  int bck_frame_index = 0, fwd_frame_index = 0;
  int cur_frame_index = cm->cur_frame->order_hint;

  if (bck_buf != NULL) bck_frame_index = bck_buf->order_hint;
  if (fwd_buf != NULL) fwd_frame_index = fwd_buf->order_hint;

  int fwd = abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                  fwd_frame_index, cur_frame_index));
  int bck = abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                  cur_frame_index, bck_frame_index));

  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;

  int above_ctx = 0, left_ctx = 0;
  const int offset = (fwd == bck);

  if (above_mi != NULL) {
    if (has_second_ref(above_mi))
      above_ctx = above_mi->compound_idx;
    else if (above_mi->ref_frame[0] == ALTREF_FRAME)
      above_ctx = 1;
  }

  if (left_mi != NULL) {
    if (has_second_ref(left_mi))
      left_ctx = left_mi->compound_idx;
    else if (left_mi->ref_frame[0] == ALTREF_FRAME)
      left_ctx = 1;
  }

  return above_ctx + left_ctx + 3 * offset;
}